

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  AActor *pAVar7;
  AInventory *pAVar8;
  uint uVar9;
  char *pcVar10;
  PClassActor *type;
  
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003e0f2c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e0f10:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0f2c:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar7 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar7 == (AActor *)0x0) goto LAB_003e0b43;
    bVar4 = DObject::IsKindOf((DObject *)pAVar7,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e0f2c;
    }
  }
  else {
    if (pAVar7 != (AActor *)0x0) goto LAB_003e0f10;
LAB_003e0b43:
    pAVar7 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003e0fc3;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003e0f19:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0fc3:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b4,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003e0b96;
    bVar4 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar4) {
      pcVar10 = "itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))";
      goto LAB_003e0fc3;
    }
    bVar4 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003e0f19;
LAB_003e0b96:
    bVar4 = true;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003e0f5d:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b5,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e0f5d;
  }
  uVar9 = param[2].field_0.i;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0fa4:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b6,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[3].field_0.i;
LAB_003e0bfc:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0f7c:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b7,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0fa4;
    }
    iVar6 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e0bfc;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0f7c;
    }
  }
  if (bVar4) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9bd,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    iVar2 = param[4].field_0.i;
    pAVar7 = COPY_AAPTR(pAVar7,iVar6);
    if (pAVar7 == (AActor *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9c4,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      pAVar8 = AActor::FindInventory(pAVar7,type,false);
      if (pAVar8 == (AInventory *)0x0) {
        if ((int)uVar9 < 1) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x9e9,
                          "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          pAVar8 = (AInventory *)Spawn(type);
          if (pAVar8 == (AInventory *)0x0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9ee,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            pAVar8->Amount = uVar9;
            pbVar1 = (byte *)((long)&(pAVar8->super_AActor).flags.Value + 2);
            *pbVar1 = *pbVar1 | 2;
            pbVar1 = (byte *)((long)&pAVar8->ItemFlags + 1);
            *pbVar1 = *pbVar1 | 0x40;
            AActor::ClearCounters((AActor *)pAVar8);
            bVar4 = AInventory::CallTryPickup(pAVar8,pAVar7,(AActor **)0x0);
            if (bVar4) {
              if (numret < 1) {
                return 0;
              }
              bVar5 = 1;
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x9fb,
                              "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              goto LAB_003e0cc6;
            }
            (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar8);
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9f9,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
        }
      }
      else {
        uVar3 = pAVar8->Amount;
        if (uVar3 != uVar9) {
          if ((int)uVar9 < 1) {
            iVar6 = (*(pAVar7->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar7,type,(ulong)uVar3,1,0);
            bVar5 = (byte)iVar6;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9d7,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else if (uVar3 - uVar9 == 0 || (int)uVar3 < (int)uVar9) {
            if ((iVar2 == 0) && (pAVar8->MaxAmount <= (int)uVar9)) {
              uVar9 = pAVar8->MaxAmount;
            }
            pAVar8->Amount = uVar9;
            if (numret < 1) {
              return 0;
            }
            bVar5 = 1;
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9e2,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            iVar6 = (*(pAVar7->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar7,type,(ulong)(uVar3 - uVar9),1,0);
            bVar5 = (byte)iVar6;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9dd,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          goto LAB_003e0cc6;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x9d1,
                        "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
  }
  bVar5 = 0;
LAB_003e0cc6:
  VMReturn::SetInt(ret,(uint)bVar5);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(itemtype, AInventory);
	PARAM_INT(amount);
	PARAM_INT_DEF(ptr);
	PARAM_BOOL_DEF(beyondMax);

	bool res = false;

	if (itemtype == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AInventory *item = mobj->FindInventory(itemtype);

	if (item != nullptr)
	{
		// A_SetInventory sets the absolute amount. 
		// Subtract or set the appropriate amount as necessary.

		if (amount == item->Amount)
		{
			// Nothing was changed.
			ACTION_RETURN_BOOL(false);
		}
		else if (amount <= 0)
		{
			//Remove it all.
			res = (mobj->TakeInventory(itemtype, item->Amount, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else if (amount < item->Amount)
		{
			int amt = abs(item->Amount - amount);
			res = (mobj->TakeInventory(itemtype, amt, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else
		{
			item->Amount = (beyondMax ? amount : clamp(amount, 0, item->MaxAmount));
			ACTION_RETURN_BOOL(true);
		}
	}
	else
	{
		if (amount <= 0)
		{
			ACTION_RETURN_BOOL(false);
		}
		item = static_cast<AInventory *>(Spawn(itemtype));
		if (item == nullptr)
		{
			ACTION_RETURN_BOOL(false);
		}
		else
		{
			item->Amount = amount;
			item->flags |= MF_DROPPED;
			item->ItemFlags |= IF_IGNORESKILL;
			item->ClearCounters();
			if (!item->CallTryPickup(mobj))
			{
				item->Destroy();
				ACTION_RETURN_BOOL(false);
			}
			ACTION_RETURN_BOOL(true);
		}
	}
	ACTION_RETURN_BOOL(false);
}